

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileSwitch(jx9_gen_state *pGen)

{
  sxu32 sVar1;
  uint uVar2;
  SySet *pSVar3;
  int iVar4;
  sxi32 sVar5;
  SyToken *pSVar6;
  SySet *pSet;
  jx9_vm *pjVar7;
  char cVar8;
  ulong uVar9;
  SySet *pSVar10;
  GenBlock **ppBlock;
  SyToken *pSVar11;
  SyToken *pSVar12;
  SyToken *pSVar13;
  sxu32 *pBlockStart;
  char cVar14;
  SyToken *pEnd;
  GenBlock *pSwitchBlock;
  SySet local_60;
  sxu32 local_38 [2];
  
  pSVar6 = pGen->pIn;
  sVar1 = pSVar6->nLine;
  pGen->pIn = pSVar6 + 1;
  if ((pSVar6 + 1 < pGen->pEnd) && ((pSVar6[1].nType & 0x200) != 0)) {
    pGen->pIn = pSVar6 + 2;
    pEnd = (SyToken *)0x0;
    sVar5 = GenStateEnterBlock(pGen,0x101,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&pSwitchBlock
                              );
    if (sVar5 != 0) {
      return -10;
    }
    jx9DelimitNestedTokens(pGen->pIn,pGen->pEnd,0x200,0x400,&pEnd);
    pSVar6 = pEnd;
    if ((pGen->pIn == pEnd) || (pSVar13 = pGen->pEnd, pSVar13 <= pEnd)) {
      sVar5 = jx9GenCompileError(pGen,1,sVar1,"Expected expression after \'switch\' keyword");
      if (sVar5 == -10) {
        return -10;
      }
      pSVar13 = pGen->pEnd;
    }
    pGen->pEnd = pSVar6;
    sVar5 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar5 == -10) {
      return -10;
    }
    pSVar11 = pGen->pIn;
    while (cVar14 = '\x01', pSVar11 < pSVar6) {
      sVar5 = jx9GenCompileError(pGen,1,pSVar11->nLine,"Switch: Unexpected token \'%z\'");
      if (sVar5 == -10) {
        return -10;
      }
      pSVar11 = pGen->pIn + 1;
      pGen->pIn = pSVar11;
    }
    pSVar11 = pSVar6 + 1;
    pGen->pIn = pSVar11;
    pGen->pEnd = pSVar13;
    pSVar12 = pSVar6;
    if (((pSVar11 < pSVar13) && (pSVar12 = pSVar11, pSVar6 + 2 < pSVar13)) &&
       ((pSVar6[1].nType & 0x100040) != 0)) {
      pGen->pIn = pSVar6 + 2;
      pSet = (SySet *)SyMemBackendAlloc(&pGen->pVm->sAllocator,0x30);
      if (pSet == (SySet *)0x0) {
        GenStateOutOfMem(pGen);
        return -10;
      }
      SyZero(pSet,0x30);
      pjVar7 = pGen->pVm;
      pSet->nUsed = 0;
      pSet->nSize = 0;
      pSet->eSize = 0x30;
      pSet->nCursor = 0;
      pSet->pAllocator = &pjVar7->sAllocator;
      pSet->pBase = (void *)0x0;
      pSet->pUserData = (void *)0x0;
      jx9VmEmitInstr(pjVar7,0x45,0,0,pSet,(sxu32 *)0x0);
      pBlockStart = (sxu32 *)((long)&pSet[1].pAllocator + 4);
      do {
        pSVar6 = pGen->pIn;
        pSVar13 = pGen->pEnd;
        if (pSVar13 <= pSVar6) goto LAB_00123ad4;
        if ((pSVar6->nType & 4) == 0) {
          if (-1 < (char)pSVar6->nType) {
LAB_00123ab3:
            sVar5 = jx9GenCompileError(pGen,1,pSVar6->nLine,"Switch: Unexpected token \'%z\'");
            if (sVar5 == -10) {
              return -10;
            }
          }
          goto LAB_00123ad4;
        }
        if (*(int *)&pSVar6->pUserData == 5) {
          pGen->pIn = pSVar6 + 1;
          pjVar7 = pGen->pVm;
          local_60.nUsed = 0;
          local_60.nSize = 0;
          local_60.eSize = 0x18;
          local_60.nCursor = 0;
          local_60.pBase = (void *)0x0;
          local_60.pUserData = (void *)0x0;
          iVar4 = 0;
          for (uVar9 = 0x20; pSVar11 = (SyToken *)((long)&(pSVar6->sData).zString + uVar9),
              pSVar11 < pSVar13; uVar9 = uVar9 + 0x20) {
            uVar2 = *(uint *)((long)&pSVar6->nType + uVar9);
            if ((uVar2 >> 9 & 1) == 0) {
              if ((uVar2 >> 10 & 1) == 0) {
                if (((uVar2 & 0x140000) != 0) && (iVar4 < 1)) break;
              }
              else {
                iVar4 = iVar4 + -1;
              }
            }
            else {
              iVar4 = iVar4 + 1;
            }
          }
          local_60.pAllocator = &pjVar7->sAllocator;
          cVar8 = cVar14;
          if (uVar9 < 0x21) {
            sVar5 = jx9GenCompileError(pGen,1,pSVar6[1].nLine,"Empty case expression");
            if (sVar5 == -10) goto LAB_00123a6f;
            pjVar7 = pGen->pVm;
            pSVar13 = pGen->pEnd;
          }
          pGen->pEnd = pSVar11;
          pSVar3 = pjVar7->pByteContainer;
          pjVar7->pByteContainer = &local_60;
          sVar5 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
          jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar5 != -3),0,(void *)0x0,(sxu32 *)0x0);
          pSVar10 = &pGen->pVm->aByteCode;
          if (pSVar3 != (SySet *)0x0) {
            pSVar10 = pSVar3;
          }
          pGen->pVm->pByteContainer = pSVar10;
          pGen->pIn = pSVar11;
          pGen->pEnd = pSVar13;
          if (sVar5 != -10) {
            sVar5 = GenStateCompileSwitchBlock(pGen,local_38);
            SySetPut(pSet,&local_60);
            if (sVar5 != -10) {
              if (sVar5 == -0x12) {
                cVar8 = '\x05';
              }
              else {
                cVar8 = '\0';
              }
            }
          }
        }
        else {
          if (*(int *)&pSVar6->pUserData != 10) goto LAB_00123ab3;
          if (*pBlockStart != 0) {
            sVar5 = jx9GenCompileError(pGen,2,pSVar6->nLine,
                                       "Switch: \'default\' case already compiled");
            if (sVar5 == -10) {
              return -10;
            }
            pSVar6 = pGen->pIn;
          }
          pGen->pIn = pSVar6 + 1;
          sVar5 = GenStateCompileSwitchBlock(pGen,pBlockStart);
          if (sVar5 == -10) {
            return -10;
          }
          cVar8 = (sVar5 == -0x12) * '\x05';
        }
LAB_00123a6f:
      } while (cVar8 == '\0');
      if (cVar8 != '\x05') {
        return -10;
      }
LAB_00123ad4:
      sVar1 = pGen->pVm->pByteContainer->nUsed;
      *(sxu32 *)&pSet[1].pAllocator = sVar1;
      ppBlock = (GenBlock **)0xffffffffffffffff;
      GenStateFixJumps(pSwitchBlock,-1,sVar1);
      GenStateLeaveBlock(pGen,ppBlock);
      if (pGen->pEnd <= pGen->pIn) {
        return 0;
      }
      pGen->pIn = pGen->pIn + 1;
      return 0;
    }
    iVar4 = jx9GenCompileError(pGen,1,pSVar12->nLine,"Switch: Unexpected token \'%z\'");
  }
  else {
    iVar4 = jx9GenCompileError(pGen,1,sVar1,"Expected \'(\' after \'switch\' keyword");
  }
  sVar5 = -10;
  if (iVar4 != -10) {
    pSVar6 = pGen->pIn;
    while ((sVar5 = 0, pSVar6 < pGen->pEnd && (sVar5 = 0, (pSVar6->nType & 0x40000) == 0))) {
      pSVar6 = pSVar6 + 1;
      pGen->pIn = pSVar6;
    }
  }
  return sVar5;
}

Assistant:

static sxi32 jx9CompileSwitch(jx9_gen_state *pGen)
{
	GenBlock *pSwitchBlock;
	SyToken *pTmp, *pEnd;
	jx9_switch *pSwitch;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'switch' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	pEnd = 0; /* cc warning */
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP|GEN_BLOCK_SWITCH, 
		jx9VmInstrLength(pGen->pVm), 0, &pSwitchBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the condition */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected expression after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, 
			"Switch: Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn  = &pEnd[1];
	pGen->pEnd = pTmp;
	if( pGen->pIn >= pGen->pEnd || &pGen->pIn[1] >= pGen->pEnd ||
		(pGen->pIn->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_COLON/*:*/)) == 0 ){
			pTmp = pGen->pIn;
			if( pTmp >= pGen->pEnd ){
				pTmp--;
			}
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pTmp->nLine, "Switch: Unexpected token '%z'", &pTmp->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
	}
	pGen->pIn++; /* Jump the leading curly braces/colons */
	/* Create the switch blocks container */
	pSwitch = (jx9_switch *)SyMemBackendAlloc(&pGen->pVm->sAllocator, sizeof(jx9_switch));
	if( pSwitch == 0 ){
		/* Abort compilation */
		return GenStateOutOfMem(pGen);
	}
	/* Zero the structure */
	SyZero(pSwitch, sizeof(jx9_switch));
	/* Initialize fields */
	SySetInit(&pSwitch->aCaseExpr, &pGen->pVm->sAllocator, sizeof(jx9_case_expr));
	/* Emit the switch instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_SWITCH, 0, 0, pSwitch, 0);
	/* Compile case blocks */
	for(;;){
		sxu32 nKwrd;
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if(  (pGen->pIn->nType & JX9_TK_CCB /*}*/) == 0 ){
				/* Unexpected token */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				/* FALL THROUGH */
			}
			/* Block compiled */
			break;
		}
		/* Extract the keyword */
		nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
		if( nKwrd == JX9_TKWRD_DEFAULT ){
			/*
			 * Accroding to the JX9 language reference manual
			 *  A special case is the default case. This case matches anything
			 *  that wasn't matched by the other cases.
			 */
			if( pSwitch->nDefault > 0 ){
				/* Default case already compiled */ 
				rc = jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Switch: 'default' case already compiled");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
			}
			pGen->pIn++; /* Jump the 'default' keyword */
			/* Compile the default block */
			rc = GenStateCompileSwitchBlock(pGen,&pSwitch->nDefault);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else if( nKwrd == JX9_TKWRD_CASE ){
			jx9_case_expr sCase;
			/* Standard case block */
			pGen->pIn++; /* Jump the 'case' keyword */
			/* initialize the structure */
			SySetInit(&sCase.aByteCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
			/* Compile the case expression */
			rc = GenStateCompileCaseExpr(pGen, &sCase);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			/* Compile the case block */
			rc = GenStateCompileSwitchBlock(pGen,&sCase.nStart);
			/* Insert in the switch container */
			SySetPut(&pSwitch->aCaseExpr, (const void *)&sCase);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else{
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
				&pGen->pIn->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			break;
		}
	}
	/* Fix all jumps now the destination is resolved */
	pSwitch->nOut = jx9VmInstrLength(pGen->pVm);
	GenStateFixJumps(pSwitchBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	if( pGen->pIn < pGen->pEnd ){
		/* Jump the trailing curly braces */
		pGen->pIn++;
	}
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}